

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingPongServer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ostream *poVar6;
  allocator<char> local_179;
  __shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2> local_178;
  shared_ptr<brynet::net::WrapTcpService> server;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  PTR listenThread;
  _Any_data local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  EventLoop mainLoop;
  
  if (argc == 3) {
    std::make_shared<brynet::net::WrapTcpService>();
    brynet::net::ListenThread::Create();
    std::__cxx11::string::string<std::allocator<char>>((string *)&mainLoop,"0.0.0.0",&local_179);
    iVar5 = atoi(argv[1]);
    std::__shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_178,
               &server.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>);
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    local_158._M_unused._M_object = operator_new(0x10);
    uVar1 = local_178._M_ptr._0_4_;
    uVar2 = local_178._M_ptr._4_4_;
    uVar3 = local_178._M_refcount._M_pi._0_4_;
    uVar4 = local_178._M_refcount._M_pi._4_4_;
    local_178._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178._M_ptr = (element_type *)0x0;
    *(undefined4 *)local_158._M_unused._0_8_ = uVar1;
    *(undefined4 *)((long)local_158._M_unused._0_8_ + 4) = uVar2;
    *(undefined4 *)((long)local_158._M_unused._0_8_ + 8) = uVar3;
    *(undefined4 *)((long)local_158._M_unused._0_8_ + 0xc) = uVar4;
    pcStack_140 = std::
                  _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/PingPongServer.cpp:29:64)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/PingPongServer.cpp:29:64)>
                ::_M_manager;
    brynet::net::ListenThread::startListen
              (listenThread.
               super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
               &mainLoop,iVar5);
    std::_Function_base::~_Function_base((_Function_base *)&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
    std::__cxx11::string::~string((string *)&mainLoop);
    iVar5 = atoi(argv[2]);
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    local_118 = 0;
    uStack_110 = 0;
    brynet::net::WrapTcpService::startWorkThread
              (server.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(long)iVar5);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    brynet::net::EventLoop::EventLoop(&mainLoop);
    do {
      brynet::net::EventLoop::loop((long)&mainLoop);
      poVar6 = std::operator<<((ostream *)&std::cout,"total recv : ");
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      poVar6 = std::operator<<(poVar6," M /s, of client num:");
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"packet num:");
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      LOCK();
      total_packet_num.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      TotalRecvSize.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
    } while( true );
  }
  fwrite("Usage: <listen port> <net work thread num>\n",0x2b,1,_stderr);
  exit(-1);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 3)
    {
        fprintf(stderr, "Usage: <listen port> <net work thread num>\n");
        exit(-1);
    }

    auto server = std::make_shared<WrapTcpService>();
    auto listenThread = ListenThread::Create();

    listenThread->startListen(false, "0.0.0.0", atoi(argv[1]), [=](TcpSocket::PTR socket){
        socket->SocketNodelay();

        auto enterCallback = [](const TCPSession::PTR& session) {
            total_client_num++;

            session->setDataCallback([](const TCPSession::PTR& session, const char* buffer, size_t len) {
                session->send(buffer, len);
                TotalRecvSize += len;
                total_packet_num++;
                return len;
            });

            session->setDisConnectCallback([](const TCPSession::PTR& session) {
                total_client_num--;
            });
        };

        server->addSession(std::move(socket),
                AddSessionOption::WithEnterCallback(enterCallback),
                AddSessionOption::WithMaxRecvBufferSize(1024*1024));
    });

    server->startWorkThread(atoi(argv[2]));

    EventLoop mainLoop;
    while (true)
    {
        mainLoop.loop(1000);
        std::cout << "total recv : " << (TotalRecvSize / 1024) / 1024 << " M /s, of client num:" << total_client_num << std::endl;
        std::cout << "packet num:" << total_packet_num << std::endl;
        total_packet_num = 0;
        TotalRecvSize = 0;
    }
}